

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumpvtt.cc
# Opt level: O2

int main(int argc,char **argv)

{
  payload_t *ppVar1;
  _List_node_base *p_Var2;
  int iVar3;
  _Self __tmp;
  _List_node_base *p_Var4;
  VttReader reader;
  Parser parser;
  Cue cue;
  
  if (argc == 2) {
    libwebvtt::VttReader::VttReader(&reader);
    iVar3 = libwebvtt::VttReader::Open(&reader,argv[1]);
    if (iVar3 == 0) {
      libwebvtt::Parser::Parser(&parser,&reader.super_Reader);
      iVar3 = libwebvtt::Parser::Init(&parser);
      if (iVar3 == 0) {
        cue.identifier._M_dataplus._M_p = (pointer)&cue.identifier.field_2;
        cue.identifier._M_string_length = 0;
        cue.identifier.field_2._M_local_buf[0] = '\0';
        cue.settings.super__List_base<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>.
        _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&cue.settings;
        cue.settings.super__List_base<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>.
        _M_impl._M_node._M_size = 0;
        ppVar1 = &cue.payload;
        cue.payload.
        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl._M_node._M_size = 0;
        cue.settings.super__List_base<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>.
        _M_impl._M_node.super__List_node_base._M_prev =
             cue.settings.super__List_base<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>.
             _M_impl._M_node.super__List_node_base._M_next;
        cue.payload.
        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)ppVar1;
        cue.payload.
        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)ppVar1;
        while( true ) {
          iVar3 = libwebvtt::Parser::Parse(&parser,&cue);
          if (iVar3 < 0) break;
          if (iVar3 != 0) {
            iVar3 = 0;
            goto LAB_00103455;
          }
          fprintf(_stdout,"cue identifier: \"%s\"\n",cue.identifier._M_dataplus._M_p);
          fprintf(_stdout,"cue start time: \"HH=%i MM=%i SS=%i SSS=%i\"\n",
                  (ulong)(uint)cue.start_time.hours,(ulong)(uint)cue.start_time.minutes,
                  (ulong)(uint)cue.start_time.seconds,(ulong)(uint)cue.start_time.milliseconds);
          fprintf(_stdout,"cue stop time: \"HH=%i MM=%i SS=%i SSS=%i\"\n",
                  (ulong)(uint)cue.stop_time.hours,(ulong)(uint)cue.stop_time.minutes,
                  (ulong)(uint)cue.stop_time.seconds,(ulong)(uint)cue.stop_time.milliseconds);
          p_Var4 = cue.settings.
                   super__List_base<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>._M_impl
                   ._M_node.super__List_node_base._M_next;
          if (cue.settings.super__List_base<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>
              ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&cue.settings) {
            fwrite("cue setting: <no settings present>\n",0x23,1,_stdout);
          }
          else {
            while (p_Var4 != (_List_node_base *)&cue.settings) {
              p_Var2 = p_Var4->_M_next;
              fprintf(_stdout,"cue setting: name=%s value=%s\n",p_Var4[1]._M_next,p_Var4[3]._M_next)
              ;
              p_Var4 = p_Var2;
            }
          }
          iVar3 = 1;
          p_Var4 = cue.payload.
                   super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl._M_node.super__List_node_base._M_next;
          while (p_Var4 != (_List_node_base *)ppVar1) {
            p_Var2 = p_Var4->_M_next;
            fprintf(_stdout,"cue payload[%i]: \"%s\"\n",iVar3,p_Var4[1]._M_next);
            iVar3 = iVar3 + 1;
            p_Var4 = p_Var2;
          }
          fputc(10,_stdout);
          fflush(_stdout);
        }
        fwrite("error parsing cue\n",0x12,1,_stderr);
        iVar3 = 1;
LAB_00103455:
        libwebvtt::Cue::~Cue(&cue);
      }
      else {
        fwrite("parser init failed\n",0x13,1,_stderr);
        iVar3 = 1;
      }
      libwebvtt::Parser::~Parser(&parser);
    }
    else {
      fwrite("open failed\n",0xc,1,_stderr);
      iVar3 = 1;
    }
    libwebvtt::VttReader::~VttReader(&reader);
  }
  else {
    fwrite("usage: dumpvtt <vtt file>\n",0x1a,1,_stdout);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int main(int argc, const char* argv[]) {
  if (argc != 2) {
    fprintf(stdout, "usage: dumpvtt <vtt file>\n");
    return EXIT_SUCCESS;
  }

  libwebvtt::VttReader reader;
  const char* const filename = argv[1];

  if (int e = reader.Open(filename)) {
    (void)e;
    fprintf(stderr, "open failed\n");
    return EXIT_FAILURE;
  }

  libwebvtt::Parser parser(&reader);

  if (int e = parser.Init()) {
    (void)e;
    fprintf(stderr, "parser init failed\n");
    return EXIT_FAILURE;
  }

  for (libwebvtt::Cue cue;;) {
    const int e = parser.Parse(&cue);

    if (e < 0) {  // error
      fprintf(stderr, "error parsing cue\n");
      return EXIT_FAILURE;
    }

    if (e > 0)  // EOF
      return EXIT_SUCCESS;

    fprintf(stdout, "cue identifier: \"%s\"\n", cue.identifier.c_str());

    const libwebvtt::Time& st = cue.start_time;
    fprintf(stdout, "cue start time: \"HH=%i MM=%i SS=%i SSS=%i\"\n", st.hours,
            st.minutes, st.seconds, st.milliseconds);

    const libwebvtt::Time& sp = cue.stop_time;
    fprintf(stdout, "cue stop time: \"HH=%i MM=%i SS=%i SSS=%i\"\n", sp.hours,
            sp.minutes, sp.seconds, sp.milliseconds);

    {
      typedef libwebvtt::Cue::settings_t::const_iterator iter_t;
      iter_t i = cue.settings.begin();
      const iter_t j = cue.settings.end();

      if (i == j) {
        fprintf(stdout, "cue setting: <no settings present>\n");
      } else {
        while (i != j) {
          const libwebvtt::Setting& setting = *i++;
          fprintf(stdout, "cue setting: name=%s value=%s\n",
                  setting.name.c_str(), setting.value.c_str());
        }
      }
    }

    {
      typedef libwebvtt::Cue::payload_t::const_iterator iter_t;
      iter_t i = cue.payload.begin();
      const iter_t j = cue.payload.end();

      int idx = 1;
      while (i != j) {
        const std::string& payload = *i++;
        const char* const payload_str = payload.c_str();
        fprintf(stdout, "cue payload[%i]: \"%s\"\n", idx, payload_str);
        ++idx;
      }
    }

    fprintf(stdout, "\n");
    fflush(stdout);
  }
}